

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

void Gia_ManFromBridgeHolds(FILE *pFile,int iPoProved)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)iPoProved;
  fprintf((FILE *)pFile,"%.6d",0x65);
  fputc(0x20,(FILE *)pFile);
  if ((uint)iPoProved < 0x80) {
    fprintf((FILE *)pFile,"%.16d",4);
    fputc(0x20,(FILE *)pFile);
    fputc(3,(FILE *)pFile);
    fputc(1,(FILE *)pFile);
  }
  else {
    uVar3 = 4;
    uVar2 = uVar4;
    do {
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar1 = (uint)uVar2;
      uVar2 = uVar2 >> 7;
    } while (0x3fff < uVar1);
    fprintf((FILE *)pFile,"%.16d",uVar3);
    fputc(0x20,(FILE *)pFile);
    fputc(3,(FILE *)pFile);
    fputc(1,(FILE *)pFile);
    do {
      uVar1 = (uint)uVar4;
      fputc(uVar1 & 0xff | 0x80,(FILE *)pFile);
      uVar4 = uVar4 >> 7;
      iPoProved = (int)uVar4;
    } while (0x3fff < uVar1);
  }
  fputc(iPoProved,(FILE *)pFile);
  fputc(0,(FILE *)pFile);
  fflush((FILE *)pFile);
}

Assistant:

void Gia_ManFromBridgeHolds( FILE * pFile, int iPoProved )
{
    fprintf( pFile, "%.6d", 101 /*message type = Result*/);
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", 3 + aigerNumSize(iPoProved) /*size in bytes*/);
    fprintf( pFile, " " );

    fputc( (char)BRIDGE_VALUE_1, pFile ); // true
    fputc( (char)1, pFile ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsignedFile( pFile, iPoProved ); // number of the property (Armin's encoding)
    fputc( (char)0, pFile ); // no invariant
    fflush(pFile);
}